

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::verify_piece(torrent *this,piece_index_t piece)

{
  bool bVar1;
  int iVar2;
  session_settings *psVar3;
  torrent_info *ptVar4;
  info_hash_t *piVar5;
  file_storage *this_00;
  undefined4 extraout_var;
  pointer ppVar6;
  anon_class_40_2_49d5364b local_120;
  function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&)>
  local_f8;
  uchar local_d1;
  undefined8 local_d0;
  undefined8 local_c8;
  int local_c0;
  uint local_bc;
  undefined1 local_b8 [8];
  span<libtorrent::digest32<256L>_> v2_span;
  storage_error local_a0;
  digest32<160L> local_88;
  piece_index_t local_74;
  container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  local_70;
  int local_54;
  int local_50;
  undefined1 local_40 [8];
  vector<sha256_hash> hashes;
  bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void> local_19;
  int write_mode;
  disk_job_flags_t flags;
  torrent *this_local;
  piece_index_t piece_local;
  
  _write_mode = this;
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>::
  bitfield_flag(&local_19);
  psVar3 = settings(this);
  iVar2 = session_settings::get_int(psVar3,0x4024);
  if (iVar2 == 3) {
    hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0x80;
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>::
    operator|=(&local_19,(bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>)0x80);
  }
  else if (iVar2 == 2) {
    hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0x80;
    hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = '\x10';
    hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ =
         libtorrent::flags::operator|
                   ((bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>)0x80,
                    (bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>)'\x10');
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>::
    operator|=(&local_19,
               hashes.
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               .
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_);
  }
  ptVar4 = torrent_file(this);
  piVar5 = torrent_info::info_hashes(ptVar4);
  bVar1 = info_hash_t::has_v1(piVar5);
  if (bVar1) {
    hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = ' ';
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>::
    operator|=(&local_19,(bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>)' ');
  }
  container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  ::container_wrapper((container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                       *)local_40);
  ptVar4 = torrent_file(this);
  piVar5 = torrent_info::info_hashes(ptVar4);
  bVar1 = info_hash_t::has_v2(piVar5);
  if (bVar1) {
    ptVar4 = torrent_file(this);
    this_00 = torrent_info::orig_files(ptVar4);
    local_50 = piece.m_val;
    iVar2 = file_storage::blocks_in_piece2(this_00,piece);
    container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
    ::resize<int,void>((container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
                        *)local_40,iVar2);
  }
  psVar3 = settings(this);
  bVar1 = session_settings::get_bool(psVar3,0x8016);
  if (bVar1) {
    ppVar6 = ::std::
             unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ::operator->(&(this->super_torrent_hot_members).m_picker);
    local_54 = piece.m_val;
    piece_picker::started_hash_job(ppVar6,piece);
    container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
    ::container_wrapper(&local_70,
                        (container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                         *)local_40);
    local_74.m_val = piece.m_val;
    digest32<160L>::digest32(&local_88);
    storage_error::storage_error(&local_a0);
    on_piece_verified(this,&local_70,local_74,&local_88,&local_a0);
    container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
    ::~container_wrapper(&local_70);
  }
  else {
    span<libtorrent::digest32<256l>>::
    span<libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::digest32<256l>,void>
              ((span<libtorrent::digest32<256l>> *)local_b8,
               (container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                *)local_40);
    iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [4])();
    local_bc = (uint)storage_holder::operator_cast_to_strong_typedef(&this->m_storage);
    local_c0 = piece.m_val;
    span<libtorrent::digest32<256l>>::
    span<libtorrent::span<libtorrent::digest32<256l>>,libtorrent::digest32<256l>,void>
              ((span<libtorrent::digest32<256l>> *)&local_d0,
               (span<libtorrent::digest32<256L>_> *)local_b8);
    local_d1 = local_19.m_val;
    ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this
              ((enable_shared_from_this<libtorrent::aux::torrent> *)&local_120);
    container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
    ::container_wrapper(&local_120.hashes1,
                        (container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                         *)local_40);
    ::std::
    function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::digest32<160l>const&,libtorrent::storage_error_const&)>
    ::
    function<libtorrent::aux::torrent::verify_piece(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>)::__0,void>
              ((function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::digest32<160l>const&,libtorrent::storage_error_const&)>
                *)&local_f8,&local_120);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x20))
              ((long *)CONCAT44(extraout_var,iVar2),local_bc,local_c0,local_d0,local_c8,local_d1,
               &local_f8);
    ::std::
    function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&)>
    ::~function(&local_f8);
    verify_piece(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>)::$_0::
    ~__0((__0 *)&local_120);
    ppVar6 = ::std::
             unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ::operator->(&(this->super_torrent_hot_members).m_picker);
    piece_picker::started_hash_job(ppVar6,piece);
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f])
              ();
  }
  v2_span.m_len._5_3_ = 0;
  v2_span.m_len._4_1_ = bVar1;
  container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  ::~container_wrapper
            ((container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
              *)local_40);
  return;
}

Assistant:

void torrent::verify_piece(piece_index_t const piece)
	{
		TORRENT_ASSERT(m_storage);
		TORRENT_ASSERT(!m_picker->is_hashing(piece));

		// we just completed the piece, it should be flushed to disk
		disk_job_flags_t flags{};

		auto const write_mode = settings().get_int(settings_pack::disk_io_write_mode);
		if (write_mode == settings_pack::write_through)
			flags |= disk_interface::flush_piece;
		else if (write_mode == settings_pack::disable_os_cache)
			flags |= disk_interface::flush_piece | disk_interface::volatile_read;
		if (torrent_file().info_hashes().has_v1())
			flags |= disk_interface::v1_hash;

		aux::vector<sha256_hash> hashes;
		if (torrent_file().info_hashes().has_v2())
		{
			hashes.resize(torrent_file().orig_files().blocks_in_piece2(piece));
		}

		if (settings().get_bool(settings_pack::disable_hash_checks))
		{
			// short-circuit the hash check if it's disabled
			m_picker->started_hash_job(piece);
			on_piece_verified(std::move(hashes), piece, sha1_hash(), storage_error{});
			return;
		}

		span<sha256_hash> v2_span(hashes);
		m_ses.disk_thread().async_hash(m_storage, piece, v2_span, flags
			, [self = shared_from_this(), hashes1 = std::move(hashes)]
			(piece_index_t p, sha1_hash const& h, storage_error const& error) mutable
			{ self->on_piece_verified(std::move(hashes1), p, h, error); });
		m_picker->started_hash_job(piece);
		m_ses.deferred_submit_jobs();
	}